

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Signal_PDU::Signal_PDU
          (Signal_PDU *this,EntityIdentifier *ID,KUINT16 RadioID,EncodingScheme *ES,
          KUINT32 SampleRate,KUINT16 Samples,KOCTET *Data,KUINT16 DataLength)

{
  KUINT16 KVar1;
  
  Radio_Communications_Header::Radio_Communications_Header
            (&this->super_Radio_Communications_Header,ID,RadioID);
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Signal_PDU_00222160;
  (this->m_EncodingScheme).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EncodingScheme_002238f0;
  KVar1 = ES->m_ui16TDLType;
  (this->m_EncodingScheme).m_EncodingSchemeUnion = ES->m_EncodingSchemeUnion;
  (this->m_EncodingScheme).m_ui16TDLType = KVar1;
  this->m_ui32SampleRate = SampleRate;
  this->m_ui16Samples = Samples;
  (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_vData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x1a';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x20;
  SetData(this,Data,DataLength);
  return;
}

Assistant:

Signal_PDU::Signal_PDU( const EntityIdentifier & ID, KUINT16 RadioID, const EncodingScheme & ES,
                        KUINT32 SampleRate, KUINT16 Samples, const KOCTET * Data, KUINT16 DataLength ) :
    Radio_Communications_Header( ID, RadioID ),
    m_EncodingScheme( ES ),
    m_ui32SampleRate( SampleRate ),
    m_ui16Samples( Samples )
{
    m_ui8PDUType = Signal_PDU_Type;
    m_ui16PDULength = SIGNAL_PDU_SIZE;
    SetData( Data, DataLength );
}